

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_paramattr_group_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  pointer pBVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
  *this_00;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  BlockOrRecord *child;
  pointer pBVar9;
  ulong uVar10;
  bool bVar11;
  uint64_t group_id;
  String value;
  char buffer [4096];
  
  if ((this->attribute_groups)._M_h._M_element_count == 0) {
    pBVar1 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar9 = (entry->children).
                  super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar11 = pBVar9 == pBVar1, !bVar11;
        pBVar9 = pBVar9 + 1) {
      if ((pBVar9->blockDwordLength == 0) && (pBVar9->id == 3)) {
        puVar6 = (pBVar9->ops).
                 super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pBVar9->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) < 0x11) {
          return bVar11;
        }
        group_id = *puVar6;
        if (puVar6[1] == 0xffffffff) {
          this_00 = (vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                     *)std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->attribute_groups,&group_id);
          uVar10 = (long)(pBVar9->ops).
                         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar9->ops).
                         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar7 = 2;
          while (uVar8 = uVar7, uVar8 < uVar10) {
            puVar6 = (pBVar9->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar2 = puVar6[uVar8];
            switch(uVar2) {
            case 0:
              uVar7 = uVar8 + 2;
              break;
            case 1:
              if (uVar10 <= uVar8 + 1) goto switchD_00173afa_caseD_2;
              uVar7 = uVar8 + 2;
              if (((ulong)(uint)puVar6[uVar8 + 1] < 0x34) &&
                 ((0x8060002000002U >> ((ulong)(uint)puVar6[uVar8 + 1] & 0x3f) & 1) != 0)) {
                uVar7 = uVar8 + 3;
              }
              break;
            default:
              goto switchD_00173afa_caseD_2;
            case 3:
            case 4:
              buffer._0_8_ = buffer + 0x10;
              buffer[8] = '\0';
              buffer[9] = '\0';
              buffer[10] = '\0';
              buffer[0xb] = '\0';
              buffer[0xc] = '\0';
              buffer[0xd] = '\0';
              buffer[0xe] = '\0';
              buffer[0xf] = '\0';
              value._M_dataplus._M_p = (pointer)&value.field_2;
              value._M_string_length = 0;
              buffer._16_8_ = buffer._16_8_ & 0xffffffffffffff00;
              value.field_2._M_local_buf[0] = '\0';
              while( true ) {
                uVar7 = uVar8 + 1;
                uVar3 = puVar6[uVar7];
                if ((uVar10 <= uVar7) || (uVar3 == 0)) break;
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           *)buffer,(char)uVar3);
                puVar6 = (pBVar9->ops).
                         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar8 = uVar7;
              }
              if (uVar3 == 0) {
                uVar7 = uVar8 + 2;
                if (uVar2 == 4) {
                  while ((uVar2 = puVar6[uVar7], uVar7 < uVar10 && (uVar2 != 0))) {
                    uVar7 = uVar7 + 1;
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    ::push_back(&value,(char)uVar2);
                    puVar6 = (pBVar9->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  }
                  if (uVar2 != 0) goto LAB_00173b80;
                  uVar7 = uVar7 + 1;
                }
                std::
                vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                ::
                emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                          (this_00,(basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                    *)buffer,&value);
                bVar11 = true;
              }
              else {
LAB_00173b80:
                bVar11 = false;
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              _M_dispose(&value);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                          *)buffer);
              if (!bVar11) goto switchD_00173afa_caseD_2;
              break;
            case 5:
            case 6:
              if (uVar10 <= uVar8 + 1) goto switchD_00173afa_caseD_2;
              uVar7 = uVar8 + 2;
              if (((int)puVar6[uVar8 + 1] == 3) && (uVar2 == 6)) {
                uVar7 = uVar8 + 3;
              }
            }
          }
          if (uVar10 < uVar8) goto switchD_00173afa_caseD_2;
        }
      }
    }
  }
  else {
    p_Var4 = dxil_spv::get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Cannot use multiple group blocks.\n",0x2b,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer,"Cannot use multiple group blocks.\n",0x23);
      pvVar5 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var4)(pvVar5,Error,buffer);
    }
switchD_00173afa_caseD_2:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static BinaryOperator::BinaryOps translate_binop(BinOp op, Type *type)
{
	bool is_fp = type->isFloatingPointTy();
	switch (op)
	{
	case BinOp::ADD:
		return is_fp ? BinaryOperator::BinaryOps::FAdd : BinaryOperator::BinaryOps::Add;
	case BinOp::SUB:
		return is_fp ? BinaryOperator::BinaryOps::FSub : BinaryOperator::BinaryOps::Sub;
	case BinOp::MUL:
		return is_fp ? BinaryOperator::BinaryOps::FMul : BinaryOperator::BinaryOps::Mul;
	case BinOp::UDIV:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::UDiv;
	case BinOp::SDIV:
		return is_fp ? BinaryOperator::BinaryOps::FDiv : BinaryOperator::BinaryOps::SDiv;
	case BinOp::UREM:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::URem;
	case BinOp::SREM:
		return is_fp ? BinaryOperator::BinaryOps::FRem : BinaryOperator::BinaryOps::SRem;
	case BinOp::SHL:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Shl;
	case BinOp::LSHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::LShr;
	case BinOp::ASHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::AShr;
	case BinOp::AND:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::And;
	case BinOp::OR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Or;
	case BinOp::XOR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Xor;
	default:
		return BinaryOperator::BinaryOps::InvalidBinaryOp;
	}
}